

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

void tvm::runtime::SaveMetaDataToFile
               (string *file_name,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
               *fmap)

{
  byte bVar1;
  char *pcVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  undefined1 local_420 [8];
  JSONWriter writer;
  ostream local_250 [8];
  ofstream fs;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string version;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
  *fmap_local;
  string *file_name_local;
  
  version.field_2._8_8_ = fmap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"0.1.0",&local_39);
  std::allocator<char>::~allocator(&local_39);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_250,pcVar2,_S_out);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)
               &writer.scope_multi_line_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/file_util.cc"
               ,0x93);
    poVar3 = dmlc::LogMessageFatal::stream_abi_cxx11_
                       ((LogMessageFatal *)
                        &writer.scope_multi_line_.super__Bvector_base<std::allocator<bool>_>._M_impl
                         .super__Bvector_impl_data._M_end_of_storage);
    poVar4 = std::operator<<((ostream *)poVar3,"Check failed: !fs.fail()");
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,"Cannot open file ");
    std::operator<<(poVar4,(string *)file_name);
    dmlc::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)
               &writer.scope_multi_line_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
  }
  dmlc::JSONWriter::JSONWriter((JSONWriter *)local_420,local_250);
  dmlc::JSONWriter::BeginObject((JSONWriter *)local_420,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"tvm_version",&local_441);
  dmlc::JSONWriter::WriteObjectKeyValue<std::__cxx11::string>
            ((JSONWriter *)local_420,&local_440,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"func_info",&local_469);
  dmlc::JSONWriter::
  WriteObjectKeyValue<std::unordered_map<std::__cxx11::string,tvm::runtime::FunctionInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tvm::runtime::FunctionInfo>>>>
            ((JSONWriter *)local_420,&local_468,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
              *)version.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  dmlc::JSONWriter::EndObject((JSONWriter *)local_420);
  std::ofstream::close();
  dmlc::JSONWriter::~JSONWriter((JSONWriter *)local_420);
  std::ofstream::~ofstream(local_250);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void SaveMetaDataToFile(
    const std::string &file_name,
    const std::unordered_map<std::string, FunctionInfo> &fmap) {
  std::string version = "0.1.0";
  std::ofstream fs(file_name.c_str());
  CHECK(!fs.fail()) << "Cannot open file " << file_name;
  dmlc::JSONWriter writer(&fs);
  writer.BeginObject();
  writer.WriteObjectKeyValue("tvm_version", version);
  writer.WriteObjectKeyValue("func_info", fmap);
  writer.EndObject();
  fs.close();
}